

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_subtraction_operation(Value *left_value,Value *right_value)

{
  double local_30;
  double right_float;
  double left_float;
  Value *right_value_local;
  Value *left_value_local;
  
  if ((left_value->value_type == ValueTypeIntegerValue) &&
     (right_value->value_type == ValueTypeIntegerValue)) {
    left_value_local = new_integer_value(*(long *)(left_value + 1) - *(long *)(right_value + 1));
  }
  else if (((left_value->value_type == ValueTypeIntegerValue) ||
           (left_value->value_type == ValueTypeFloatValue)) &&
          ((right_value->value_type == ValueTypeIntegerValue ||
           (right_value->value_type == ValueTypeFloatValue)))) {
    if (left_value->value_type == ValueTypeFloatValue) {
      right_float = (double)*(longdouble *)&left_value[1].linked_variable_count;
    }
    else {
      right_float = (double)*(long *)(left_value + 1);
    }
    if (right_value->value_type == ValueTypeFloatValue) {
      local_30 = (double)*(longdouble *)&right_value[1].linked_variable_count;
    }
    else {
      local_30 = (double)*(long *)(right_value + 1);
    }
    left_value_local = new_float_value((longdouble)(right_float - local_30));
  }
  else {
    left_value_local = new_null_value();
  }
  return left_value_local;
}

Assistant:

Value *apply_subtraction_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_integer_value(((IntegerValue *) left_value)->integer_value - ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_float_value(left_float - right_float);
  }

  return new_null_value();
}